

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O0

size_t mi_good_size(size_t size)

{
  size_t sVar1;
  ulong in_RDI;
  undefined8 local_8;
  
  if (in_RDI < 0x10001) {
    sVar1 = mi_bin(size);
    local_8 = _mi_bin_size(sVar1);
  }
  else {
    sVar1 = _mi_os_page_size();
    local_8 = _mi_align_up(in_RDI,sVar1);
  }
  return local_8;
}

Assistant:

size_t mi_good_size(size_t size) mi_attr_noexcept {
  if (size <= MI_MEDIUM_OBJ_SIZE_MAX) {
    return _mi_bin_size(mi_bin(size + MI_PADDING_SIZE));
  }
  else {
    return _mi_align_up(size + MI_PADDING_SIZE,_mi_os_page_size());
  }
}